

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::drawAnimatedOperation(QTreeViewPrivate *this,QPainter *painter)

{
  QPixmap *pQVar1;
  int y;
  int iVar2;
  uint y_00;
  int iVar3;
  int sh;
  QPixmap *pQVar4;
  QPixmap *pQVar5;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVariantAnimation::startValue();
  y = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVariantAnimation::endValue();
  iVar2 = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVariantAnimation::currentValue();
  y_00 = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  iVar3 = QAbstractAnimation::direction();
  pQVar1 = &(this->animatedOperation).before;
  pQVar4 = &(this->animatedOperation).after;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = pQVar4;
  if (iVar3 != 1) {
    pQVar5 = pQVar1;
    pQVar1 = pQVar4;
  }
  QPixmap::QPixmap((QPixmap *)local_58.data,(QPixmap *)pQVar1);
  iVar3 = QPixmap::width();
  sh = QPixmap::height();
  QPainter::drawPixmap(painter,0,y,(QPixmap *)local_58.data,0,~y_00 + iVar2,iVar3,sh);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_78,(QPixmap *)pQVar5);
  QPainter::drawPixmap(painter,0,y_00,(QPixmap *)&local_78);
  QPixmap::~QPixmap((QPixmap *)&local_78);
  QPixmap::~QPixmap((QPixmap *)local_58.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::drawAnimatedOperation(QPainter *painter) const
{
    const int start = animatedOperation.startValue().toInt(),
        end = animatedOperation.endValue().toInt(),
        current = animatedOperation.currentValue().toInt();
    bool collapsing = animatedOperation.direction() == QVariantAnimation::Backward;
    const QPixmap top = collapsing ? animatedOperation.before : animatedOperation.after;
    painter->drawPixmap(0, start, top, 0, end - current - 1, top.width(), top.height());
    const QPixmap bottom = collapsing ? animatedOperation.after : animatedOperation.before;
    painter->drawPixmap(0, current, bottom);
}